

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O2

uint32_t helper_ceb(CPUS390XState_conflict *env,uint64_t f1,uint64_t f2)

{
  int float_compare;
  uint32_t uVar1;
  uintptr_t unaff_retaddr;
  
  float_compare = float32_compare_quiet_s390x((float32)f1,(float32)f2,&env->fpu_status);
  handle_exceptions(env,false,unaff_retaddr);
  uVar1 = float_comp_to_cc(env,float_compare);
  return uVar1;
}

Assistant:

uint32_t HELPER(ceb)(CPUS390XState *env, uint64_t f1, uint64_t f2)
{
    int cmp = float32_compare_quiet(f1, f2, &env->fpu_status);
    handle_exceptions(env, false, GETPC());
    return float_comp_to_cc(env, cmp);
}